

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
          (Memory *this,u64 offset,u64 addend,uint rhs,BinopFunc<unsigned_int,_unsigned_int> **func,
          uint *out)

{
  pointer puVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  Memory *pMVar6;
  Enum EVar7;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  bVar3 = false;
  if (((3 < uVar4) && (offset <= uVar4)) && (addend <= uVar4)) {
    bVar3 = addend + offset + 4 <= uVar4;
  }
  uVar4 = addend + offset;
  bVar3 = (bool)((uVar4 & 3) == 0 & bVar3);
  pMVar6 = this;
  if (bVar3) {
    pMVar6 = (Memory *)(ulong)*(uint *)(puVar1 + uVar4);
  }
  EVar7 = Error;
  if (bVar3) {
    uVar2 = (**func)((uint)pMVar6,rhs);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    bVar3 = false;
    if (((3 < uVar5) && (bVar3 = false, offset <= uVar5)) && (addend <= uVar5)) {
      bVar3 = uVar4 + 4 <= uVar5;
    }
    if (((uVar4 & 3) == 0) && (bVar3)) {
      *(uint *)(puVar1 + uVar4) = uVar2;
      *out = (uint)pMVar6;
      EVar7 = Ok;
    }
  }
  return (Result)EVar7;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}